

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O2

void jinit_phuff_decoder(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  int (*paiVar2) [64];
  int iVar3;
  long lVar4;
  
  pjVar1 = (jpeg_entropy_decoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x68);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass_phuff_decoder;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    *(undefined8 *)(&pjVar1[2].insufficient_data + lVar4 * 2) = 0;
  }
  paiVar2 = (int (*) [64])
            (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(long)cinfo->num_components << 9);
  cinfo->coef_bits = paiVar2;
  for (iVar3 = 0; iVar3 < cinfo->num_components; iVar3 = iVar3 + 1) {
    for (lVar4 = 0; (int)lVar4 != 0x100; lVar4 = lVar4 + 4) {
      *(undefined4 *)((long)*paiVar2 + lVar4) = 0xffffffff;
    }
    paiVar2 = (int (*) [64])((long)*paiVar2 + lVar4);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_phuff_decoder(j_decompress_ptr cinfo)
{
  phuff_entropy_ptr entropy;
  int *coef_bit_ptr;
  int ci, i;

  entropy = (phuff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(phuff_entropy_decoder));
  cinfo->entropy = (struct jpeg_entropy_decoder *)entropy;
  entropy->pub.start_pass = start_pass_phuff_decoder;

  /* Mark derived tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->derived_tbls[i] = NULL;
  }

  /* Create progression status table */
  cinfo->coef_bits = (int (*)[DCTSIZE2])
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                cinfo->num_components * 2 * DCTSIZE2 *
                                sizeof(int));
  coef_bit_ptr = &cinfo->coef_bits[0][0];
  for (ci = 0; ci < cinfo->num_components; ci++)
    for (i = 0; i < DCTSIZE2; i++)
      *coef_bit_ptr++ = -1;
}